

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

lzma_ret lzma_strm_init(lzma_stream *strm)

{
  lzma_allocator *plVar1;
  lzma_internal *plVar2;
  
  if (strm == (lzma_stream *)0x0) {
    return LZMA_PROG_ERROR;
  }
  plVar2 = strm->internal;
  if (plVar2 == (lzma_internal *)0x0) {
    plVar1 = strm->allocator;
    if ((plVar1 == (lzma_allocator *)0x0) ||
       (plVar1->alloc == (_func_void_ptr_void_ptr_size_t_size_t *)0x0)) {
      plVar2 = (lzma_internal *)malloc(0x58);
    }
    else {
      plVar2 = (lzma_internal *)(*plVar1->alloc)(plVar1->opaque,1,0x58);
    }
    strm->internal = plVar2;
    if (plVar2 == (lzma_internal *)0x0) {
      return LZMA_MEM_ERROR;
    }
    (plVar2->next).memconfig =
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict12 *)
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
    (plVar2->next).update =
         (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict12
          *)(_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
    (plVar2->next).end = (lzma_end_function_conflict11)(lzma_end_function)0x0;
    (plVar2->next).get_check =
         (_func_lzma_check_lzma_coder_ptr_conflict12 *)(_func_lzma_check_lzma_coder_ptr *)0x0;
    (plVar2->next).init = 0;
    (plVar2->next).code = (lzma_code_function_conflict11)(lzma_code_function)0x0;
    (plVar2->next).coder = (lzma_coder_conflict13 *)(lzma_coder *)0x0;
    (plVar2->next).id = 0xffffffffffffffff;
    plVar2 = strm->internal;
  }
  plVar2->sequence = ISEQ_RUN;
  plVar2->supported_actions[0] = false;
  plVar2->supported_actions[1] = false;
  plVar2->supported_actions[2] = false;
  plVar2->supported_actions[3] = false;
  plVar2->allow_buf_error = false;
  strm->total_in = 0;
  strm->total_out = 0;
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_strm_init(lzma_stream *strm)
{
	if (strm == NULL)
		return LZMA_PROG_ERROR;

	if (strm->internal == NULL) {
		strm->internal = lzma_alloc(sizeof(lzma_internal),
				strm->allocator);
		if (strm->internal == NULL)
			return LZMA_MEM_ERROR;

		strm->internal->next = LZMA_NEXT_CODER_INIT;
	}

	strm->internal->supported_actions[LZMA_RUN] = false;
	strm->internal->supported_actions[LZMA_SYNC_FLUSH] = false;
	strm->internal->supported_actions[LZMA_FULL_FLUSH] = false;
	strm->internal->supported_actions[LZMA_FINISH] = false;
	strm->internal->sequence = ISEQ_RUN;
	strm->internal->allow_buf_error = false;

	strm->total_in = 0;
	strm->total_out = 0;

	return LZMA_OK;
}